

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_AddCommand(cmsysProcess *cp,char **command)

{
  long *plVar1;
  uint uVar2;
  char ***__ptr;
  ulong uVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  size_t __size;
  long lVar8;
  
  if (command == (char **)0x0 || cp == (cmsysProcess *)0x0) {
    return 0;
  }
  pcVar5 = *command;
  if (pcVar5 == (char *)0x0) {
    return 0;
  }
  uVar2 = cp->NumberOfCommands;
  __ptr = (char ***)malloc((long)(int)uVar2 * 8 + 8);
  if (__ptr == (char ***)0x0) {
    return 0;
  }
  uVar3 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    __ptr[uVar3] = cp->Commands[uVar3];
  }
  if (cp->Verbatim == 0) {
    __size = 0;
    do {
      plVar1 = (long *)((long)command + __size);
      __size = __size + 8;
    } while (*plVar1 != 0);
    ppcVar4 = (char **)malloc(__size);
    __ptr[(int)uVar2] = ppcVar4;
    if (ppcVar4 == (char **)0x0) goto LAB_0010387a;
    lVar7 = ((long)__size >> 3) + -1;
    lVar8 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar8;
    }
    for (; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      if (command[lVar8] == (char *)0x0) {
        __assert_fail("command[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/kwsys/ProcessUNIX.c"
                      ,0x1cd,"int cmsysProcess_AddCommand(cmsysProcess *, const char *const *)");
      }
      pcVar5 = strdup(command[lVar8]);
      ppcVar4[lVar8] = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_00103875;
    }
    ppcVar4[((long)__size >> 3) + -1] = (char *)0x0;
  }
  else {
    ppcVar4 = cmsysSystem_Parse_CommandForUnix(pcVar5,0);
    __ptr[cp->NumberOfCommands] = ppcVar4;
    if ((ppcVar4 == (char **)0x0) || (*ppcVar4 == (char *)0x0)) {
      free(__ptr);
      return 0;
    }
  }
  free(cp->Commands);
  cp->Commands = __ptr;
  cp->NumberOfCommands = uVar2 + 1;
  return 1;
LAB_00103875:
  for (; 0 < lVar8; lVar8 = lVar8 + -1) {
    free(__ptr[cp->NumberOfCommands][lVar8 + -1]);
  }
LAB_0010387a:
  free(__ptr);
  return 0;
}

Assistant:

int kwsysProcess_AddCommand(kwsysProcess* cp, char const* const* command)
{
  int newNumberOfCommands;
  char*** newCommands;

  /* Make sure we have a command to add.  */
  if(!cp || !command || !*command)
    {
    return 0;
    }

  /* Allocate a new array for command pointers.  */
  newNumberOfCommands = cp->NumberOfCommands + 1;
  if(!(newCommands =
       (char***)malloc(sizeof(char**) *(size_t)(newNumberOfCommands))))
    {
    /* Out of memory.  */
    return 0;
    }

  /* Copy any existing commands into the new array.  */
  {
  int i;
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    newCommands[i] = cp->Commands[i];
    }
  }

  /* Add the new command.  */
  if(cp->Verbatim)
    {
    /* In order to run the given command line verbatim we need to
       parse it.  */
    newCommands[cp->NumberOfCommands] =
      kwsysSystem_Parse_CommandForUnix(*command, 0);
    if(!newCommands[cp->NumberOfCommands] ||
       !newCommands[cp->NumberOfCommands][0])
      {
      /* Out of memory or no command parsed.  */
      free(newCommands);
      return 0;
      }
    }
  else
    {
    /* Copy each argument string individually.  */
    char const* const* c = command;
    kwsysProcess_ptrdiff_t n = 0;
    kwsysProcess_ptrdiff_t i = 0;
    while(*c++);
    n = c - command - 1;
    newCommands[cp->NumberOfCommands] =
      (char**)malloc((size_t)(n+1)*sizeof(char*));
    if(!newCommands[cp->NumberOfCommands])
      {
      /* Out of memory.  */
      free(newCommands);
      return 0;
      }
    for(i=0; i < n; ++i)
      {
      assert(command[i]); /* Quiet Clang scan-build. */
      newCommands[cp->NumberOfCommands][i] = strdup(command[i]);
      if(!newCommands[cp->NumberOfCommands][i])
        {
        break;
        }
      }
    if(i < n)
      {
      /* Out of memory.  */
      for(;i > 0; --i)
        {
        free(newCommands[cp->NumberOfCommands][i-1]);
        }
      free(newCommands);
      return 0;
      }
    newCommands[cp->NumberOfCommands][n] = 0;
    }

  /* Successfully allocated new command array.  Free the old array. */
  free(cp->Commands);
  cp->Commands = newCommands;
  cp->NumberOfCommands = newNumberOfCommands;

  return 1;
}